

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O0

void __thiscall
wabt::FileStream::FileStream(FileStream *this,string_view filename,Stream *log_stream)

{
  char *__filename;
  FILE *pFVar1;
  undefined8 uVar2;
  uint *puVar3;
  allocator<char> local_49;
  string local_48 [8];
  string filename_str;
  Stream *log_stream_local;
  FileStream *this_local;
  string_view filename_local;
  
  filename_local._M_len = (size_t)filename._M_str;
  this_local = (FileStream *)filename._M_len;
  filename_str.field_2._8_8_ = log_stream;
  Stream::Stream(&this->super_Stream,log_stream);
  (this->super_Stream)._vptr_Stream = (_func_int **)&PTR__FileStream_0019f5f0;
  this->file_ = (FILE *)0x0;
  this->offset_ = 0;
  this->should_close_ = false;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (local_48,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,&local_49);
  std::allocator<char>::~allocator(&local_49);
  __filename = (char *)std::__cxx11::string::c_str();
  pFVar1 = fopen(__filename,"wb");
  this->file_ = (FILE *)pFVar1;
  pFVar1 = _stderr;
  if (this->file_ == (FILE *)0x0) {
    uVar2 = std::__cxx11::string::c_str();
    puVar3 = (uint *)__errno_location();
    fprintf(pFVar1,"%s:%d: fopen name=\"%s\" failed, errno=%d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/stream.cc",
            0xf1,uVar2,(ulong)*puVar3);
  }
  else {
    this->should_close_ = true;
  }
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

FileStream::FileStream(std::string_view filename, Stream* log_stream)
    : Stream(log_stream), file_(nullptr), offset_(0), should_close_(false) {
  std::string filename_str(filename);
  file_ = fopen(filename_str.c_str(), "wb");

  // TODO(binji): this is pretty cheesy, should come up with a better API.
  if (file_) {
    should_close_ = true;
  } else {
    ERROR("fopen name=\"%s\" failed, errno=%d\n", filename_str.c_str(), errno);
  }
}